

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe30At5(uint8_t *buf)

{
  ulong uVar1;
  ulong local_18;
  uint64_t res;
  uint8_t *buf_local;
  
  uVar1 = ((ulong)*(uint *)(buf + 1) & 0x7ffffff) << 3;
  local_18 = (long)((int)(uint)*buf >> 5) | uVar1;
  if (uVar1 >> 0x1d != 0) {
    local_18 = local_18 | 0xffffffffc0000000;
  }
  return local_18;
}

Assistant:

std::int64_t readFlSIntLe30At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 3;
    res |= (buf[0] >> 5);
    res &= UINT64_C(0x3fffffff);

    if (res >> 29) {
        res |= UINT64_C(0xffffffffc0000000);
    }

    return static_cast<std::int64_t>(res);
}